

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDA.hpp
# Opt level: O0

ScanStatus * __thiscall
PCCompatible::MDA::get_scaled_scan_status(ScanStatus *__return_storage_ptr__,MDA *this)

{
  ScanStatus local_60;
  ScanStatus local_38;
  MDA *local_10;
  MDA *this_local;
  
  local_10 = this;
  Outputs::CRT::CRT::get_scaled_scan_status(&local_60,(CRT *)this);
  Outputs::Display::ScanStatus::operator*(&local_38,&local_60,596591.0);
  Outputs::Display::ScanStatus::operator/(__return_storage_ptr__,&local_38,8.1285e+06);
  return __return_storage_ptr__;
}

Assistant:

Outputs::Display::ScanStatus get_scaled_scan_status() const {
			return outputter_.crt.get_scaled_scan_status() * 596591.0f / 8128500.0f;
		}